

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotLoadGraphic(Fifteen *this)

{
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QImage image;
  long local_38;
  QArrayDataPointer<char16_t> local_28;
  
  QString::QString((QString *)&local_68,(char *)0x0);
  QString::QString((QString *)&local_80,"");
  QDir::currentPath();
  tr((QString *)&local_28,"JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)",(char *)0x0,-1);
  QFileDialog::getOpenFileName(&image,this,&local_80,&local_98,&local_28,0,0);
  pDVar1 = local_68.d;
  local_68.d = _image;
  _image = pDVar1;
  local_68.size = local_38;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&image);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (local_68.size != 0) {
    QImage::QImage(&image);
    QImage::load((QString *)&image,(char *)&local_68);
    cVar2 = QImage::isNull();
    if (cVar2 == '\0') {
      bVar3 = Controller::loadGraphic
                        ((this->controller)._M_t.
                         super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                         super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                         super__Head_base<0UL,_Controller_*,_false>._M_head_impl,&image);
      if (bVar3) {
        MenuBar::setActionMenuState
                  ((this->menuBar)._M_t.
                   super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
                   super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
                   super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,REM_GRAPHIC,true);
      }
      QString::QString((QString *)&local_80,"");
      Message::getMessages();
      QMessageBox::information(this,&local_80,&local_98,0x400,0);
    }
    else {
      QString::QString((QString *)&local_80,"");
      QString::QString((QString *)&local_98,"Failure of loading an image\t");
      QMessageBox::information(this,&local_80,&local_98,0x400,0);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QImage::~QImage(&image);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  return;
}

Assistant:

void Fifteen::slotLoadGraphic()
{
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath(), tr( "JPG, PNG, GIF, BMP (*.jpg *.png *.gif *.bmp)" ));
         file.isEmpty())
    {
        return;
    }

    QImage image;
    if ( image.load( file ); image.isNull() )
    {
        QMessageBox::information( this, "", "Failure of loading an image\t" );
        return;
    }

    if ( controller->loadGraphic( image ))
    {
        menuBar->setActionMenuState( ActionMenu::REM_GRAPHIC, true );
    }
    QMessageBox::information( this, "", Message::getMessages() );
}